

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O3

unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> __thiscall
jaegertracing::Tracer::startSpanInternal
          (Tracer *this,SpanContext *context,string *operationName,time_point *startTimeSystem,
          time_point *startTimeSteady,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *internalTags,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
          *tags,bool newTrace,
          vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *references)

{
  string *psVar1;
  __node_base_ptr p_Var2;
  long *plVar3;
  int iVar4;
  Span *this_00;
  undefined4 extraout_var;
  __buckets_ptr pp_Var5;
  string *key;
  pointer *__ptr;
  undefined7 in_stack_00000011;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *in_stack_00000020;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> spanTags;
  Tag local_78;
  
  plVar3 = (long *)CONCAT71(in_stack_00000011,newTrace);
  spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::reserve
            (&spanTags,
             (*(long *)(tags + 8) - *(long *)tags >> 3) * -0x71c71c71c71c71c7 +
             (plVar3[1] - *plVar3 >> 3) * -0x71c71c71c71c71c7);
  key = (string *)*plVar3;
  psVar1 = (string *)plVar3[1];
  if (key != psVar1) {
    do {
      Tag::Tag<opentracing::v3::Value_const&>(&local_78,key,(Value *)(key + 1));
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
      emplace_back<jaegertracing::Tag>(&spanTags,&local_78);
      opentracing::v3::util::
      variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
      ::~variant(&local_78._value.super_variant_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._key._M_dataplus._M_p != &local_78._key.field_2) {
        operator_delete(local_78._key._M_dataplus._M_p);
      }
      key = (string *)&key[2]._M_string_length;
    } while (key != psVar1);
  }
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&spanTags,
             spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
             _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)tags,*(undefined8 *)(tags + 8)
            );
  this_00 = (Span *)operator_new(0x170);
  std::__shared_ptr<jaegertracing::Tracer_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jaegertracing::Tracer,void>
            ((__shared_ptr<jaegertracing::Tracer_const,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2> *)&context->_traceID);
  Span::Span(this_00,(shared_ptr<const_jaegertracing::Tracer> *)&local_78,
             (SpanContext *)operationName,(string *)startTimeSystem,(time_point *)startTimeSteady,
             (time_point *)internalTags,&spanTags,in_stack_00000020);
  (this->super_Tracer)._vptr_Tracer = (_func_int **)this_00;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._key._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._key._M_string_length);
  }
  p_Var2 = context[1]._baggage._M_h._M_buckets[4];
  (*(code *)p_Var2->_M_nxt[2]._M_nxt)(p_Var2,1);
  iVar4 = (*(this_00->super_Span)._vptr_Span[10])(this_00);
  pp_Var5 = context[1]._baggage._M_h._M_buckets;
  if ((*(byte *)(CONCAT44(extraout_var,iVar4) + 0x28) & 1) == 0) {
    p_Var2 = pp_Var5[7];
    (*(code *)p_Var2->_M_nxt[2]._M_nxt)(p_Var2,1);
    if ((char)references == '\0') goto LAB_001b9776;
    pp_Var5 = context[1]._baggage._M_h._M_buckets + 1;
  }
  else {
    p_Var2 = pp_Var5[6];
    (*(code *)p_Var2->_M_nxt[2]._M_nxt)(p_Var2,1);
    if ((char)references == '\0') goto LAB_001b9776;
    pp_Var5 = context[1]._baggage._M_h._M_buckets;
  }
  (*(code *)(*pp_Var5)->_M_nxt[2]._M_nxt)(*pp_Var5,1);
LAB_001b9776:
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&spanTags);
  return (__uniq_ptr_data<jaegertracing::Span,_std::default_delete<jaegertracing::Span>,_true,_true>
         )(__uniq_ptr_data<jaegertracing::Span,_std::default_delete<jaegertracing::Span>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Span>
Tracer::startSpanInternal(const SpanContext& context,
                          const std::string& operationName,
                          const SystemClock::time_point& startTimeSystem,
                          const SteadyClock::time_point& startTimeSteady,
                          const std::vector<Tag>& internalTags,
                          const std::vector<OpenTracingTag>& tags,
                          bool newTrace,
                          const std::vector<Reference>& references) const
{
    std::vector<Tag> spanTags;
    spanTags.reserve(tags.size() + internalTags.size());
    std::transform(
        std::begin(tags),
        std::end(tags),
        std::back_inserter(spanTags),
        [](const OpenTracingTag& tag) { return Tag(tag.first, tag.second); });
    spanTags.insert(
        std::end(spanTags), std::begin(internalTags), std::end(internalTags));

    std::unique_ptr<Span> span(new Span(shared_from_this(),
                                        context,
                                        operationName,
                                        startTimeSystem,
                                        startTimeSteady,
                                        spanTags,
                                        references));

    _metrics->spansStarted().inc(1);
    if (span->context().isSampled()) {
        _metrics->spansSampled().inc(1);
        if (newTrace) {
            _metrics->tracesStartedSampled().inc(1);
        }
    }
    else {
        _metrics->spansNotSampled().inc(1);
        if (newTrace) {
            _metrics->tracesStartedNotSampled().inc(1);
        }
    }

    return span;
}